

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Bad.c
# Opt level: O2

DdNode * Llb_BddComputeBad(Aig_Man_t *pInit,DdManager *dd,abctime TimeOut)

{
  int iVar1;
  DdNode *pDVar2;
  void *pvVar3;
  Vec_Ptr_t *p;
  DdNode *n;
  int i;
  
  iVar1 = Cudd_ReadSize(dd);
  if (iVar1 != pInit->nObjs[2]) {
    __assert_fail("Cudd_ReadSize(dd) == Aig_ManCiNum(pInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Bad.c"
                  ,0x33,"DdNode *Llb_BddComputeBad(Aig_Man_t *, DdManager *, abctime)");
  }
  pDVar2 = Cudd_ReadOne(dd);
  (pInit->pConst1->field_5).pData = pDVar2;
  for (iVar1 = 0; iVar1 < pInit->nRegs; iVar1 = iVar1 + 1) {
    pvVar3 = Vec_PtrEntry(pInit->vCis,pInit->nTruePis + iVar1);
    pDVar2 = Cudd_bddIthVar(dd,iVar1);
    *(DdNode **)((long)pvVar3 + 0x28) = pDVar2;
  }
  for (iVar1 = 0; iVar1 < pInit->nTruePis; iVar1 = iVar1 + 1) {
    pvVar3 = Vec_PtrEntry(pInit->vCis,iVar1);
    pDVar2 = Cudd_bddIthVar(dd,pInit->nRegs + iVar1);
    *(DdNode **)((long)pvVar3 + 0x28) = pDVar2;
  }
  p = Aig_ManDfsNodes(pInit,(Aig_Obj_t **)pInit->vCos->pArray,pInit->nTruePos);
  iVar1 = 0;
  do {
    if (p->nSize <= iVar1) {
      pDVar2 = Cudd_ReadLogicZero(dd);
      Cudd_Ref(pDVar2);
      for (iVar1 = 0; iVar1 < pInit->nTruePos; iVar1 = iVar1 + 1) {
        pvVar3 = Vec_PtrEntry(pInit->vCos,iVar1);
        n = Cudd_bddOr(dd,pDVar2,
                       (DdNode *)
                       ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                       *(ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28)));
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar2);
        pDVar2 = n;
      }
      for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
        pvVar3 = Vec_PtrEntry(p,iVar1);
        if (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7) {
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar3 + 0x28));
        }
      }
      Vec_PtrFree(p);
      Cudd_Deref(pDVar2);
      return pDVar2;
    }
    pvVar3 = Vec_PtrEntry(p,iVar1);
    if (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7) {
      pDVar2 = Cudd_bddAnd(dd,(DdNode *)
                              ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                              *(ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28)
                              ),(DdNode *)
                                ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^
                                *(ulong *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) +
                                          0x28)));
      *(DdNode **)((long)pvVar3 + 0x28) = pDVar2;
      if (pDVar2 == (DdNode *)0x0) {
        for (i = 0; iVar1 != i; i = i + 1) {
          pvVar3 = Vec_PtrEntry(p,i);
          if (*(DdNode **)((long)pvVar3 + 0x28) != (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar3 + 0x28));
          }
        }
        Vec_PtrFree(p);
        return (DdNode *)0x0;
      }
      Cudd_Ref(pDVar2);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Computes bad in working manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
DdNode * Llb_BddComputeBad( Aig_Man_t * pInit, DdManager * dd, abctime TimeOut )
{
    Vec_Ptr_t * vNodes;
    DdNode * bBdd0, * bBdd1, * bTemp, * bResult;
    Aig_Obj_t * pObj;
    int i, k;
    assert( Cudd_ReadSize(dd) == Aig_ManCiNum(pInit) );
    // initialize elementary variables
    Aig_ManConst1(pInit)->pData = Cudd_ReadOne( dd );
    Saig_ManForEachLo( pInit, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, i );
    Saig_ManForEachPi( pInit, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ManRegNum(pInit) + i );
    // compute internal nodes
    vNodes = Aig_ManDfsNodes( pInit, (Aig_Obj_t **)Vec_PtrArray(pInit->vCos), Saig_ManPoNum(pInit) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeOut );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }
    // quantify PIs of each PO
    bResult = Cudd_ReadLogicZero( dd );  Cudd_Ref( bResult );
    Saig_ManForEachPo( pInit, pObj, i )
    {
        bBdd0   = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bResult = Cudd_bddOr( dd, bTemp = bResult, bBdd0 );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // deref
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    }
    Vec_PtrFree( vNodes );
    Cudd_Deref( bResult );
    return bResult;
}